

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O0

bool __thiscall Refal2::CSetBuilder<int>::Export(CSetBuilder<int> *this,CFastSet<int> *exportTo)

{
  bool bVar1;
  bool local_21;
  CFastSet<int> *exportTo_local;
  CSetBuilder<int> *this_local;
  
  local_21 = false;
  if (this->fullSetStatus != S_Thru) {
    local_21 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty(&this->thru);
  }
  if (local_21 == false) {
    __assert_fail("fullSetStatus != S_Thru && thru.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/SetBuilder.h"
                  ,0x38,"bool Refal2::CSetBuilder<int>::Export(CFastSet<T> &) [T = int]");
  }
  bVar1 = this->fullSetStatus != S_Yes;
  if (bVar1) {
    CFastSet<int>::operator=(exportTo,&this->yes);
  }
  else {
    CFastSet<int>::operator=(exportTo,&this->no);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool CSetBuilder<T>::Export( CFastSet<T>& exportTo )
{
	assert( fullSetStatus != S_Thru && thru.empty() );
	if( fullSetStatus == S_Yes ) {
		exportTo = no;
		return true;
	} else {
		exportTo = yes;
		return false;
	}
}